

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BN.cpp
# Opt level: O0

BN * __thiscall BN::modbase(BN *__return_storage_ptr__,BN *this,bt *diviser)

{
  divide_by_zero *this_00;
  size_type sVar1;
  const_reference pvVar2;
  reference pvVar3;
  ulong local_38;
  size_t i;
  bt2 curr;
  bt *diviser_local;
  BN *this_local;
  BN *result;
  
  if (*diviser != 0) {
    i._0_4_ = 0;
    local_38 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size(&this->ba);
    while( true ) {
      local_38 = local_38 - 1;
      sVar1 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size(&this->ba);
      if (sVar1 <= local_38) break;
      pvVar2 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                         (&this->ba,local_38);
      i._0_4_ = ((uint)*pvVar2 + (uint)i * 0x10000) % (uint)*diviser;
    }
    BN(__return_storage_ptr__);
    pvVar3 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                       (&__return_storage_ptr__->ba,0);
    *pvVar3 = (value_type)(uint)i;
    return __return_storage_ptr__;
  }
  this_00 = (divide_by_zero *)__cxa_allocate_exception(0x10);
  divide_by_zero::divide_by_zero(this_00);
  __cxa_throw(this_00,&divide_by_zero::typeinfo,divide_by_zero::~divide_by_zero);
}

Assistant:

const BN BN::modbase(const bt &diviser)const
{
    if(diviser == 0)
        throw divide_by_zero();
    bt2 curr=0;
    for (size_t i = ba.size()- 1; i < ba.size(); --i) {
        curr <<= bz8;
        curr += ba[i];
        curr %= diviser;
    }

    BN result;
    result.ba[0]=curr;

    return result;
}